

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_concat(lua_State *L,int total)

{
  StkId top_00;
  undefined4 uVar1;
  bool bVar2;
  ulong local_a8;
  TString *local_98;
  TString *x_;
  TValue *io;
  char buff [40];
  size_t l;
  TString *ts;
  size_t tl;
  TValue *io1;
  int n;
  StkId top;
  int total_local;
  lua_State *L_local;
  
  top._4_4_ = total;
  do {
    top_00 = L->top;
    io1._4_4_ = 2;
    if (((top_00[-2].tt_ & 0xfU) == 4) || ((top_00[-2].tt_ & 0xfU) == 3)) {
      if ((top_00[-1].tt_ & 0xfU) != 4) {
        if ((top_00[-1].tt_ & 0xfU) != 3) goto LAB_0011ce78;
        luaO_tostring(L,top_00 + -1);
      }
      if ((top_00[-1].tt_ == 0x44) && (top_00[-1].value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
        if (((top_00[-2].tt_ & 0xfU) != 4) && ((top_00[-2].tt_ & 0xfU) == 3)) {
          luaO_tostring(L,top_00 + -2);
        }
      }
      else if ((top_00[-2].tt_ == 0x44) &&
              (top_00[-2].value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
        top_00[-2].value_ = top_00[-1].value_;
        uVar1 = *(undefined4 *)&top_00[-1].field_0xc;
        top_00[-2].tt_ = top_00[-1].tt_;
        *(undefined4 *)&top_00[-2].field_0xc = uVar1;
      }
      else {
        if ((top_00[-1].value_.gc)->tt == '\x04') {
          local_98 = (TString *)(ulong)(byte)top_00[-1].value_.f[0xb];
        }
        else {
          local_98 = *(TString **)(top_00[-1].value_.f + 0x10);
        }
        ts = local_98;
        io1._4_4_ = 1;
        while( true ) {
          bVar2 = false;
          if (((io1._4_4_ < top._4_4_) &&
              (bVar2 = true, (top_00[-1 - (long)io1._4_4_].tt_ & 0xfU) != 4)) &&
             (bVar2 = (top_00[-1 - (long)io1._4_4_].tt_ & 0xfU) == 3, bVar2)) {
            luaO_tostring(L,top_00 + (-1 - (long)io1._4_4_));
          }
          if (!bVar2) break;
          if ((top_00[-1 - (long)io1._4_4_].value_.gc)->tt == '\x04') {
            local_a8 = (ulong)(byte)top_00[-1 - (long)io1._4_4_].value_.f[0xb];
          }
          else {
            local_a8 = *(ulong *)(top_00[-1 - (long)io1._4_4_].value_.f + 0x10);
          }
          if (0x7fffffffffffffffU - (long)ts <= local_a8) {
            luaG_runerror(L,"string length overflow");
          }
          ts = (TString *)((long)&ts->next + local_a8);
          io1._4_4_ = io1._4_4_ + 1;
        }
        if (ts < (TString *)0x29) {
          copy2buff(top_00,io1._4_4_,(char *)&io);
          l = (size_t)luaS_newlstr(L,(char *)&io,(size_t)ts);
        }
        else {
          l = (size_t)luaS_createlngstrobj(L,(size_t)ts);
          copy2buff(top_00,io1._4_4_,(char *)(l + 0x18));
        }
        top_00[-(long)io1._4_4_].value_.i = l;
        top_00[-(long)io1._4_4_].tt_ = *(byte *)(l + 8) | 0x40;
      }
    }
    else {
LAB_0011ce78:
      luaT_trybinTM(L,top_00 + -2,top_00 + -1,top_00 + -2,TM_CONCAT);
    }
    top._4_4_ = top._4_4_ - (io1._4_4_ + -1);
    L->top = L->top + -(long)(io1._4_4_ + -1);
    if (top._4_4_ < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat(lua_State *L, int total) {
    lua_assert(total >= 2);
    do {
        StkId top = L->top;
        int n = 2;  /* number of elements handled in this pass (at least 2) */
        if (!(ttisstring(top - 2) || cvt2str(top - 2)) || !tostring(L, top - 1))
            luaT_trybinTM(L, top - 2, top - 1, top - 2, TM_CONCAT);
        else if (isemptystr(top - 1))  /* second operand is empty? */
            cast_void(tostring(L, top - 2));  /* result is first operand */
        else if (isemptystr(top - 2)) {  /* first operand is an empty string? */
            setobjs2s(L, top - 2, top - 1);  /* result is second op. */
        } else {
            /* at least two non-empty string values; get as many as possible */
            size_t tl = vslen(top - 1);
            TString *ts;
            /* collect total length and number of strings */
            for (n = 1; n < total && tostring(L, top - n - 1); n++) {
                size_t l = vslen(top - n - 1);
                if (l >= (MAX_SIZE / sizeof(char)) - tl)
                    luaG_runerror(L, "string length overflow");
                tl += l;
            }
            if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
                char buff[LUAI_MAXSHORTLEN];
                copy2buff(top, n, buff);  /* copy strings to buffer */
                ts = luaS_newlstr(L, buff, tl);
            } else {  /* long string; copy strings directly to final result */
                ts = luaS_createlngstrobj(L, tl);
                copy2buff(top, n, getstr(ts));
            }
            setsvalue2s(L, top - n, ts);  /* create result */
        }
        total -= n - 1;  /* got 'n' strings to create 1 new */
        L->top -= n - 1;  /* popped 'n' strings and pushed one */
    } while (total > 1);  /* repeat until only 1 result left */
}